

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_2,_2> __thiscall
deqp::gles3::Functional::MatrixCaseUtils::negate<float,2,2>
          (MatrixCaseUtils *this,Matrix<float,_2,_2> *mat)

{
  undefined1 auVar1 [16];
  long lVar2;
  int c;
  MatrixCaseUtils *pMVar3;
  Matrix<float,_2,_2> *retVal;
  int col;
  long lVar4;
  bool bVar5;
  uint uVar6;
  float fVar7;
  undefined4 uVar8;
  Matrix<float,_2,_2> MVar9;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar2 = 0;
  pMVar3 = this;
  do {
    lVar4 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar8 = 0;
      }
      *(undefined4 *)(pMVar3 + lVar4 * 8) = uVar8;
      auVar1 = _DAT_01a305b0;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    pMVar3 = pMVar3 + 4;
    bVar5 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar5);
  uVar6 = (uint)DAT_01a305b0;
  fVar7 = DAT_01a305b0._4_4_;
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      MVar9.m_data.m_data[1].m_data[0] =
           (float)((uint)*(float *)((long)mat + lVar4 * 2 * 4) ^ uVar6);
      MVar9.m_data.m_data[1].m_data[1] = fVar7;
      *(float *)(this + lVar4 * 8) = MVar9.m_data.m_data[1].m_data[0];
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    mat = (Matrix<float,_2,_2> *)((long)mat + 4);
    this = this + 4;
    bVar5 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar5);
  MVar9.m_data.m_data[0].m_data[0] = SUB84(auVar1._0_8_,0);
  MVar9.m_data.m_data[0].m_data[1] = SUB84(auVar1._0_8_,4);
  return (Matrix<float,_2,_2>)MVar9.m_data.m_data;
}

Assistant:

tcu::Matrix<T, Rows, Cols> negate (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = -mat(r, c);

	return retVal;
}